

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_spy_ImportEnumerator.cpp
# Opt level: O0

void __thiscall axl::spy::ImportIteratorBase::reset(ImportIteratorBase *this)

{
  C *in_RDI;
  StringRef *in_stack_ffffffffffffff88;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffff90;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this_00;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this_01;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_58;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_28;
  
  this_01 = &local_28;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(this_01,in_RDI);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x152501);
  this_00 = &local_58;
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase(this_01,in_RDI);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::operator=
            (this_00,in_stack_ffffffffffffff88);
  sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x152533);
  in_RDI[0x40] = '\0';
  in_RDI[0x41] = '\0';
  in_RDI[0x42] = '\0';
  in_RDI[0x43] = '\0';
  in_RDI[0x44] = '\0';
  in_RDI[0x45] = '\0';
  in_RDI[0x46] = '\0';
  in_RDI[0x47] = '\0';
  return;
}

Assistant:

void
ImportIteratorBase::reset() {
	m_symbolName = NULL;
	m_moduleName = NULL;
	m_slot = NULL;
}